

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

Address * __thiscall
cfd::core::Extkey::GetPubkeyAddress
          (Address *__return_storage_ptr__,Extkey *this,AddressType address_type,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters,NetType net_type)

{
  CfdException *this_00;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addresses;
  string local_58;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> local_38;
  
  GetPubkeyAddressesInternal(&local_38,this,address_type,network_parameters,net_type);
  if (local_38.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_38.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    core::Address::Address
              (__return_storage_ptr__,
               local_38.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
               _M_impl.super__Vector_impl_data._M_start);
    ::std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector(&local_38);
    return __return_storage_ptr__;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"address list is empty.","")
  ;
  CfdException::CfdException(this_00,kCfdInternalError,&local_58);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Address Extkey::GetPubkeyAddress(
    AddressType address_type,
    const std::vector<AddressFormatData>* network_parameters,
    NetType net_type) {
  auto addresses = GetPubkeyAddressesInternal(
      *this, address_type, network_parameters, net_type);
  if (addresses.empty()) {
    throw CfdException(CfdError::kCfdInternalError, "address list is empty.");
  }
  return addresses[0];
}